

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O0

void gba_write_byte(uint32_t addr,uint8_t value,access_type_t access_type)

{
  uint16_t old_value_00;
  _Bool _Var1;
  uint8_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int in_EDX;
  uint uVar6;
  uint address;
  byte in_SIL;
  uint in_EDI;
  bool bVar7;
  uint32_t upper_index_1;
  uint32_t lower_index_1;
  uint32_t index_3;
  uint32_t upper_index;
  uint32_t lower_index;
  uint32_t index_2;
  uint32_t index_1;
  uint32_t index;
  uint16_t region;
  uint32_t regnum_1;
  uint32_t shifted_value_1;
  uint32_t offset_1;
  uint16_t shifted_value;
  uint32_t offset;
  uint8_t size;
  uint32_t *ioreg_1;
  uint32_t *initial;
  uint32_t *current;
  uint32_t maskedaddr;
  uint16_t old_value;
  uint16_t *ioreg;
  uint32_t regnum;
  int mode;
  bool local_12f;
  bool local_12e;
  bool local_12d;
  uint32_t in_stack_fffffffffffffed4;
  uint32_t in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  gba_apu_t *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined2 in_stack_fffffffffffffefe;
  gbamem_t *in_stack_ffffffffffffff00;
  byte bStack_ad;
  char local_94;
  char local_8c;
  bg_referencepoint_container_t *local_70;
  bg_referencepoint_t *local_68;
  ushort local_3c;
  gba_ppu_t *local_28;
  addr_27b_t *local_8;
  
  bStack_ad = (byte)(in_EDI >> 0x18);
  uVar3 = (ushort)bStack_ad;
  if (in_EDX != 0) {
    if (in_EDX == 1) {
      cpu->this_step_ticks = sequential_byte_half_cycles[uVar3] + cpu->this_step_ticks;
    }
    else if (in_EDX == 2) {
      cpu->this_step_ticks = nonsequential_byte_half_cycles[uVar3] + cpu->this_step_ticks;
    }
  }
  switch(uVar3) {
  case 0:
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  Tried to write to the BIOS!\n\x1b[0;m");
    }
    break;
  default:
    break;
  case 2:
    mem->ewram[in_EDI + 0xfe000000 & 0x3ffff] = in_SIL;
    break;
  case 3:
    mem->iwram[in_EDI + 0xfd000000 & 0x7fff] = in_SIL;
    break;
  case 4:
    if (0x40003ff < in_EDI) {
      return;
    }
    _Var1 = is_ioreg_writable(in_EDI);
    if (!_Var1) {
      if (gba_log_verbosity == 0) {
        return;
      }
      printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m",
             (ulong)in_EDI);
      return;
    }
    uVar2 = get_ioreg_size_for_addr(in_EDI);
    if (uVar2 == '\x02') {
      local_8c = (char)(in_EDI & 1);
      uVar3 = (ushort)in_SIL << (local_8c << 3);
      uVar6 = in_EDI - (in_EDI & 1);
      local_3c = (ushort)(0xff << (local_8c << 3));
      uVar5 = uVar6 & 0xfff;
      switch(uVar5) {
      case 0:
        local_28 = (gba_ppu_t *)&ppu->DISPCNT;
        break;
      default:
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
                0x1ce);
        fprintf(_stderr,"Access to unknown (but valid) half ioreg addr 0x%08X\n\x1b[0;m",
                (ulong)uVar6);
        exit(1);
      case 2:
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
        }
        local_28 = (gba_ppu_t *)0x0;
        break;
      case 4:
        local_28 = (gba_ppu_t *)&ppu->DISPSTAT;
        break;
      case 6:
        local_28 = ppu;
        break;
      case 8:
        local_28 = (gba_ppu_t *)&ppu->BG0CNT;
        break;
      case 10:
        local_28 = (gba_ppu_t *)&ppu->BG1CNT;
        break;
      case 0xc:
        local_28 = (gba_ppu_t *)&ppu->BG2CNT;
        break;
      case 0xe:
        local_28 = (gba_ppu_t *)&ppu->BG3CNT;
        break;
      case 0x10:
        local_28 = (gba_ppu_t *)&ppu->BG0HOFS;
        break;
      case 0x12:
        local_28 = (gba_ppu_t *)&ppu->BG0VOFS;
        break;
      case 0x14:
        local_28 = (gba_ppu_t *)&ppu->BG1HOFS;
        break;
      case 0x16:
        local_28 = (gba_ppu_t *)&ppu->BG1VOFS;
        break;
      case 0x18:
        local_28 = (gba_ppu_t *)&ppu->BG2HOFS;
        break;
      case 0x1a:
        local_28 = (gba_ppu_t *)&ppu->BG2VOFS;
        break;
      case 0x1c:
        local_28 = (gba_ppu_t *)&ppu->BG3HOFS;
        break;
      case 0x1e:
        local_28 = (gba_ppu_t *)&ppu->BG3VOFS;
        break;
      case 0x20:
        local_28 = (gba_ppu_t *)&ppu->BG2PA;
        break;
      case 0x22:
        local_28 = (gba_ppu_t *)&ppu->BG2PB;
        break;
      case 0x24:
        local_28 = (gba_ppu_t *)&ppu->BG2PC;
        break;
      case 0x26:
        local_28 = (gba_ppu_t *)&ppu->BG2PD;
        break;
      case 0x30:
        local_28 = (gba_ppu_t *)&ppu->BG3PA;
        break;
      case 0x32:
        local_28 = (gba_ppu_t *)&ppu->BG3PB;
        break;
      case 0x34:
        local_28 = (gba_ppu_t *)&ppu->BG3PC;
        break;
      case 0x36:
        local_28 = (gba_ppu_t *)&ppu->BG3PD;
        break;
      case 0x40:
        local_28 = (gba_ppu_t *)&ppu->WIN0H;
        break;
      case 0x42:
        local_28 = (gba_ppu_t *)&ppu->WIN1H;
        break;
      case 0x44:
        local_28 = (gba_ppu_t *)&ppu->WIN0V;
        break;
      case 0x46:
        local_28 = (gba_ppu_t *)&ppu->WIN1V;
        break;
      case 0x48:
        local_28 = (gba_ppu_t *)&ppu->WININ;
        break;
      case 0x4a:
        local_28 = (gba_ppu_t *)&ppu->WINOUT;
        break;
      case 0x4c:
        local_28 = (gba_ppu_t *)&ppu->MOSAIC;
        break;
      case 0x50:
        local_28 = (gba_ppu_t *)&ppu->BLDCNT;
        break;
      case 0x52:
        local_28 = (gba_ppu_t *)&ppu->BLDALPHA;
        break;
      case 0x54:
        local_28 = (gba_ppu_t *)&ppu->BLDY;
        break;
      case 0x60:
      case 0x62:
      case 100:
      case 0x68:
      case 0x6c:
      case 0x70:
      case 0x72:
      case 0x74:
      case 0x78:
      case 0x7c:
      case 0x80:
      case 0x82:
      case 0x84:
      case 0x90:
      case 0x92:
      case 0x94:
      case 0x96:
      case 0x98:
      case 0x9a:
      case 0x9c:
      case 0x9e:
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m",
                 (ulong)uVar5);
        }
        local_28 = (gba_ppu_t *)0x0;
        break;
      case 0x88:
        local_28 = (gba_ppu_t *)&bus->SOUNDBIAS;
        break;
      case 0xb8:
        local_28 = (gba_ppu_t *)&bus->DMA0CNT_L;
        break;
      case 0xba:
        local_28 = (gba_ppu_t *)&bus->DMA0CNT_H;
        break;
      case 0xc4:
        local_28 = (gba_ppu_t *)&bus->DMA1CNT_L;
        break;
      case 0xc6:
        local_28 = (gba_ppu_t *)&bus->DMA1CNT_H;
        break;
      case 0xd0:
        local_28 = (gba_ppu_t *)&bus->DMA2CNT_L;
        break;
      case 0xd2:
        local_28 = (gba_ppu_t *)&bus->DMA2CNT_H;
        break;
      case 0xdc:
        local_28 = (gba_ppu_t *)&bus->DMA3CNT_L;
        break;
      case 0xde:
        local_28 = (gba_ppu_t *)&bus->DMA3CNT_H;
        break;
      case 0x100:
        local_28 = (gba_ppu_t *)bus->TMCNT_L;
        break;
      case 0x102:
        local_28 = (gba_ppu_t *)bus->TMCNT_H;
        break;
      case 0x104:
        local_28 = (gba_ppu_t *)(bus->TMCNT_L + 1);
        break;
      case 0x106:
        local_28 = (gba_ppu_t *)(bus->TMCNT_H + 1);
        break;
      case 0x108:
        local_28 = (gba_ppu_t *)(bus->TMCNT_L + 2);
        break;
      case 0x10a:
        local_28 = (gba_ppu_t *)(bus->TMCNT_H + 2);
        break;
      case 0x10c:
        local_28 = (gba_ppu_t *)(bus->TMCNT_L + 3);
        break;
      case 0x10e:
        local_28 = (gba_ppu_t *)(bus->TMCNT_H + 3);
        break;
      case 0x120:
      case 0x122:
      case 0x124:
      case 0x126:
      case 0x128:
      case 0x12a:
      case 0x150:
      case 0x154:
      case 0x158:
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m",(ulong)uVar5)
          ;
        }
        local_28 = (gba_ppu_t *)0x0;
        break;
      case 0x130:
        local_28 = (gba_ppu_t *)&bus->KEYINPUT;
        break;
      case 0x132:
        local_28 = (gba_ppu_t *)&bus->KEYCNT;
        break;
      case 0x134:
        local_28 = (gba_ppu_t *)&bus->RCNT;
        break;
      case 0x140:
        local_28 = (gba_ppu_t *)&bus->JOYCNT;
        break;
      case 0x200:
        local_28 = (gba_ppu_t *)&bus->interrupt_enable;
        break;
      case 0x202:
        local_28 = (gba_ppu_t *)&bus->IF;
        break;
      case 0x204:
        local_28 = (gba_ppu_t *)&bus->WAITCNT;
        break;
      case 0x208:
        local_28 = (gba_ppu_t *)bus;
      }
      if (local_28 == (gba_ppu_t *)0x0) {
        if (gba_log_verbosity == 0) {
          return;
        }
        printf("\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m",(ulong)uVar6);
        return;
      }
      uVar5 = uVar6 & 0xfff;
      if (uVar5 == 4) {
        local_3c = local_3c & 0xfff8;
      }
      else {
        if (uVar5 == 0x202) {
          (bus->IF).raw = (bus->IF).raw & (uVar3 ^ 0xffff);
          return;
        }
        if (uVar5 == 0x208) {
          local_3c = 1;
        }
      }
      old_value_00 = local_28->y;
      local_28->y = local_28->y & ~local_3c;
      local_28->y = local_28->y | uVar3 & local_3c;
      uVar6 = uVar6 & 0xfff;
      if (uVar6 != 0xb8) {
        if (uVar6 == 0xba) {
          if (-1 < (short)(bus->DMA0CNT_H).raw) {
            (bus->DMA0INT).previously_enabled = false;
          }
          gba_dma();
          return;
        }
        if (uVar6 != 0xc4) {
          if (uVar6 == 0xc6) {
            if (-1 < (short)(bus->DMA1CNT_H).raw) {
              (bus->DMA1INT).previously_enabled = false;
            }
            gba_dma();
            return;
          }
          if (uVar6 != 0xd0) {
            if (uVar6 == 0xd2) {
              if (-1 < (short)(bus->DMA2CNT_H).raw) {
                (bus->DMA2INT).previously_enabled = false;
              }
              gba_dma();
              return;
            }
            if (uVar6 != 0xdc) {
              if (uVar6 == 0xde) {
                if (-1 < (short)(bus->DMA3CNT_H).raw) {
                  (bus->DMA3INT).previously_enabled = false;
                }
                gba_dma();
                return;
              }
              if (uVar6 == 0x102) {
                tmcnth_write(0,old_value_00);
                return;
              }
              if (uVar6 == 0x106) {
                tmcnth_write(1,old_value_00);
                return;
              }
              if (uVar6 != 0x10a) {
                if (uVar6 == 0x10e) {
                  tmcnth_write(3,old_value_00);
                  return;
                }
                if (uVar6 != 0x204) {
                  return;
                }
                on_waitcnt_updated();
                return;
              }
              tmcnth_write(2,old_value_00);
              return;
            }
          }
        }
      }
      gba_dma();
      return;
    }
    if (uVar2 != '\x04') {
      if ((in_EDI & 0xfff) == 0x300) {
        if (gba_log_verbosity == 0) {
          return;
        }
        printf("\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m");
        return;
      }
      if ((in_EDI & 0xfff) == 0x301) {
        if ((in_SIL & 1) == 0) {
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
          }
          cpu->halt = true;
          return;
        }
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
                0x139);
        fprintf(_stderr,"Wrote to HALTCNT with bit 0 being 1\n\x1b[0;m");
        exit(1);
      }
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x141);
      fprintf(_stderr,"Write to unknown (but valid) byte ioreg addr 0x%08X == 0x%02X\n\x1b[0;m",
              (ulong)in_EDI,(ulong)in_SIL);
      exit(1);
    }
    local_94 = (char)(in_EDI & 3);
    uVar5 = (uint)in_SIL << (local_94 << 3);
    address = in_EDI - (in_EDI & 3);
    uVar6 = 0xff << (local_94 << 3);
    uVar4 = address & 0xfff;
    if ((((uVar4 == 0x28) || (uVar4 == 0x2c)) || (uVar4 == 0x38)) || (uVar4 == 0x3c)) {
      switch(uVar4) {
      case 0x28:
        local_68 = &(ppu->BG2X).current;
        local_70 = &ppu->BG2X;
        break;
      default:
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
                0x298);
        fprintf(_stderr,"Fatal error- should not have ended up here.\n\x1b[0;m");
        exit(1);
      case 0x2c:
        local_68 = &(ppu->BG2Y).current;
        local_70 = &ppu->BG2Y;
        break;
      case 0x38:
        local_68 = &(ppu->BG3X).current;
        local_70 = &ppu->BG3X;
        break;
      case 0x3c:
        local_68 = &(ppu->BG3Y).current;
        local_70 = &ppu->BG3Y;
      }
      bVar7 = false;
      if (0xa0 < ppu->y) {
        bVar7 = ppu->y != 0xe3;
      }
      if (!bVar7) {
        local_68->raw = (uVar6 ^ 0xffffffff) & local_68->raw;
        local_68->raw = uVar5 & uVar6 | local_68->raw;
      }
      (local_70->initial).raw = (uVar6 ^ 0xffffffff) & (local_70->initial).raw;
      (local_70->initial).raw = uVar5 & uVar6 | (local_70->initial).raw;
      return;
    }
    if (uVar4 == 0xa0) {
      write_fifo(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed4);
      return;
    }
    if (uVar4 == 0xa4) {
      write_fifo(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed4);
      return;
    }
    _Var1 = is_ioreg_writable(address);
    if (!_Var1) {
      if (gba_log_verbosity == 0) {
        return;
      }
      printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m",
             (ulong)address);
      return;
    }
    uVar2 = get_ioreg_size_for_addr(address);
    if (uVar2 != '\x04') {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x25f);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
              "Trying to get the address of a wrong-sized word ioreg");
      exit(1);
    }
    uVar4 = address & 0xfff;
    if (uVar4 == 0x28) {
      local_8 = (addr_27b_t *)&ppu->BG2X;
    }
    else if (uVar4 == 0x2c) {
      local_8 = (addr_27b_t *)&ppu->BG2Y;
    }
    else if (uVar4 == 0x38) {
      local_8 = (addr_27b_t *)&ppu->BG3X;
    }
    else if (uVar4 == 0x3c) {
      local_8 = (addr_27b_t *)&ppu->BG3Y;
    }
    else if ((uVar4 == 0xa0) || (uVar4 == 0xa4)) {
LAB_0014152a:
      local_8 = (addr_27b_t *)0x0;
    }
    else if (uVar4 == 0xb0) {
      local_8 = &bus->DMA0SAD;
    }
    else if (uVar4 == 0xb4) {
      local_8 = &bus->DMA0DAD;
    }
    else if (uVar4 == 0xbc) {
      local_8 = (addr_27b_t *)&bus->DMA1SAD;
    }
    else if (uVar4 == 0xc0) {
      local_8 = &bus->DMA1DAD;
    }
    else if (uVar4 == 200) {
      local_8 = (addr_27b_t *)&bus->DMA2SAD;
    }
    else if (uVar4 == 0xcc) {
      local_8 = &bus->DMA2DAD;
    }
    else if (uVar4 == 0xd4) {
      local_8 = (addr_27b_t *)&bus->DMA3SAD;
    }
    else {
      if (uVar4 != 0xd8) {
        if (((uVar4 != 0x150) && (uVar4 != 0x154)) && (uVar4 != 0x800)) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                  ,0x273);
          fprintf(_stderr,
                  "Tried to get the address of an unknown (but valid) word ioreg addr: 0x%08X\n\x1b[0;m"
                  ,(ulong)address);
          exit(1);
        }
        goto LAB_0014152a;
      }
      local_8 = (addr_27b_t *)&bus->DMA3DAD;
    }
    if (local_8 == (addr_27b_t *)0x0) {
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m",
               (ulong)address,(ulong)uVar6);
      }
    }
    else {
      local_8->raw = (uVar6 ^ 0xffffffff) & local_8->raw;
      local_8->raw = uVar5 & uVar6 | local_8->raw;
    }
    break;
  case 5:
    uVar5 = in_EDI + 0xfb000000 & 0x3fe;
    ppu->pram[uVar5] = in_SIL;
    ppu->pram[uVar5 + 1] = in_SIL;
    break;
  case 6:
    uVar3 = (ppu->DISPCNT).raw & 7;
    local_12d = uVar3 < 3 || 5 < uVar3;
    if (local_12d) {
      local_12f = 0x5ffffff < in_EDI && in_EDI < 0x6010000;
    }
    else {
      local_12e = 0x5ffffff < in_EDI && in_EDI < 0x6014000;
      local_12f = local_12e;
    }
    if (local_12f) {
      uVar5 = (in_EDI + 0xfa000000) % 0x18000 & 0xfffffffe;
      ppu->vram[uVar5] = in_SIL;
      ppu->vram[uVar5 + 1] = in_SIL;
    }
    break;
  case 7:
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    if ((bus->backup_type == EEPROM) && ((mem->rom_size < 0x1000001 || (0xdfffeff < in_EDI)))) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x44c);
      fprintf(_stderr,"Write byte 0x%02X to EEPROM at addr 0x%08X\n\x1b[0;m",(ulong)in_SIL,
              (ulong)in_EDI);
      exit(1);
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Ignoring write to cartridge space address 0x%08X\n",(ulong)in_EDI);
    }
    break;
  case 0xe:
  case 0xf:
    switch(bus->backup_type) {
    case UNKNOWN:
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Tried to access backup when backup type unknown!\n\x1b[0;m");
      }
      break;
    case SRAM:
      mem->backup[in_EDI & 0x7fff] = in_SIL;
      mem->backup_dirty = true;
      break;
    case EEPROM:
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Ignoring byte write to EEPROM: [0x%08X]=0x%02X\n\x1b[0;m",
               (ulong)in_EDI,(ulong)in_SIL);
      }
      break;
    case FLASH64K:
    case FLASH128K:
      write_byte_flash(in_stack_ffffffffffffff00,
                       (gbabus_t *)
                       CONCAT26(in_stack_fffffffffffffefe,
                                CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
                       in_stack_fffffffffffffef4,(uint8_t)((uint)in_stack_fffffffffffffef0 >> 0x18))
      ;
      break;
    default:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x465);
      fprintf(_stderr,"Unknown backup type index %d!\n\x1b[0;m",(ulong)bus->backup_type);
      exit(1);
    }
  }
  return;
}

Assistant:

void gba_write_byte(word addr, byte value, access_type_t access_type) {
    addr &= ~(sizeof(byte) - 1);
    half region = addr >> 24;
    tick_memory_waitstate(access_type, sizeof(byte), region);
    switch (region) {
        case REGION_BIOS: {
            logwarn("Tried to write to the BIOS!")
            break;
        }
        case REGION_EWRAM: {
            word index = (addr - 0x02000000) % 0x40000;
            mem->ewram[index] = value;
            break;
        }
        case REGION_IWRAM: {
            word index = (addr - 0x03000000) % 0x8000;
            mem->iwram[index] = value;
            break;
        }
        case REGION_IOREG: {
            if (addr < 0x04000400) {
                write_byte_ioreg(addr, value);
            }
#ifdef ENABLE_MGBA_DEBUG
            else {
                if (addr == 0x4FFF700 || addr == 0x4FFF780 || (addr >= 0x4FFF600 && addr < 0x4FFF700)) {
                    mgba_debug_write_byte(addr, value);
                } else {
                    logwarn("Write 0x%02X to 0x%08X\n", value, addr)
                }
            }
#endif
            break;
        }
        case REGION_PRAM: {
            word index = (addr - 0x5000000) % 0x400;
            word lower_index = index & 0xFFFFFFFE;
            word upper_index = lower_index + 1;
            ppu->pram[lower_index] = value;
            ppu->pram[upper_index] = value;
            break;
        }
        case REGION_VRAM: {
            word index = addr - 0x06000000;
            index %= VRAM_SIZE;
            // Special case for single byte writes to VRAM, OBJ writes are ignored.
            if (is_bg(addr)) {
                word lower_index = index & 0xFFFFFFFE;
                word upper_index = lower_index + 1;
                ppu->vram[lower_index] = value;
                ppu->vram[upper_index] = value;
            }
            break;
        }
        case REGION_OAM: {
            break; // 8 bit writes to OAM are ignored
        }
        case REGION_GAMEPAK0_L:
        case REGION_GAMEPAK0_H:
        case REGION_GAMEPAK1_L:
        case REGION_GAMEPAK1_H:
        case REGION_GAMEPAK2_L:
        case REGION_GAMEPAK2_H: {
            if (bus->backup_type == EEPROM) {
                if (mem->rom_size <= 0x1000000 || addr >= 0xDFFFF00) {
                    logfatal("Write byte 0x%02X to EEPROM at addr 0x%08X", value, addr)
                }
            }
            logdebug("Ignoring write to cartridge space address 0x%08X", addr)
            break;
        }
        case REGION_SRAM:
        case REGION_SRAM_MIRR:
            // Backup space
            switch (bus->backup_type) {
                case SRAM:
                    mem->backup[addr & 0x7FFF] = value;
                    mem->backup_dirty = true;
                    break;
                case UNKNOWN:
                    logwarn("Tried to access backup when backup type unknown!")
                    break;
                case EEPROM:
                    logwarn("Ignoring byte write to EEPROM: [0x%08X]=0x%02X", addr, value)
                    break;
                case FLASH64K:
                case FLASH128K:
                    write_byte_flash(mem, bus, addr, value);
                    break;
                default:
                    logfatal("Unknown backup type index %d!", bus->backup_type)
            }
            break;
        default:
            return;
    }
}